

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O1

fct_test_t * fct_test_new(char *name)

{
  fct_test_t *test;
  void **ppvVar1;
  
  test = (fct_test_t *)malloc(0x148);
  if (test != (fct_test_t *)0x0) {
    fctstr_safe_cpy(test->name,name,0x100);
    ppvVar1 = (void **)malloc(0x40);
    (test->failed_chks).itm_list = (void **)0x0;
    (test->failed_chks).avail_itm_num = 0;
    (test->failed_chks).used_itm_num = 0;
    (test->passed_chks).itm_list = ppvVar1;
    if (ppvVar1 != (void **)0x0) {
      (test->passed_chks).avail_itm_num = 8;
      (test->passed_chks).used_itm_num = 0;
      (test->timer).start = 0;
      (test->timer).stop = 0;
      (test->timer).duration = 0.0;
      return test;
    }
    fct_test__del(test);
  }
  return (fct_test_t *)0x0;
}

Assistant:

static fct_test_t*
fct_test_new(char const *name)
{
    nbool_t ok =FCT_FALSE;
    fct_test_t *test =NULL;

    test = (fct_test_t*)malloc(sizeof(fct_test_t));
    if ( test == NULL )
    {
        return NULL;
    }

    fctstr_safe_cpy(test->name, name, FCT_MAX_NAME);

    /* Failures are an exception, so lets not allocate up
    the list until we need to. */
    fct_nlist__init2(&(test->failed_chks), 0);
    if (!fct_nlist__init(&(test->passed_chks)))
    {
        ok =FCT_FALSE;
        goto finally;
    }

    fct_timer__init(&(test->timer));

    ok =FCT_TRUE;
finally:
    if ( !ok )
    {
        fct_test__del(test);
        test =NULL;
    }
    return test;
}